

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_section.hpp
# Opt level: O2

bool __thiscall
ELFIO::section_impl<ELFIO::Elf32_Shdr>::load_data(section_impl<ELFIO::Elf32_Shdr> *this)

{
  unique_ptr<char[],_std::default_delete<char[]>_> *this_00;
  uint uVar1;
  uint uVar2;
  int iVar3;
  ulong uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  pointer __p;
  bool bVar6;
  streampos sVar7;
  ulong uVar5;
  
  uVar1 = (this->header).sh_offset;
  uVar2 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  if (this->convertor->need_conversion == false) {
    uVar2 = uVar1;
  }
  sVar7 = address_translator::operator[](this->translator,(streampos)ZEXT416(uVar2));
  uVar4 = sVar7._M_off;
  iVar3 = (*(this->super_section)._vptr_section[0x13])(this);
  uVar5 = CONCAT44(extraout_var,iVar3);
  iVar3 = (*(this->super_section)._vptr_section[0x20])(this);
  if (CONCAT44(extraout_var_00,iVar3) < uVar4) {
    return false;
  }
  iVar3 = (*(this->super_section)._vptr_section[0x20])(this);
  if (CONCAT44(extraout_var_01,iVar3) < uVar5) {
    return false;
  }
  iVar3 = (*(this->super_section)._vptr_section[0x20])(this);
  if (uVar5 <= CONCAT44(extraout_var_02,iVar3) - uVar4) {
    bVar6 = true;
    if ((this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
        super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
        super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) {
      this_00 = &this->data;
      iVar3 = (*(this->super_section)._vptr_section[5])(this);
      if ((iVar3 != 0) && (iVar3 = (*(this->super_section)._vptr_section[5])(this), iVar3 != 8)) {
        if (uVar5 == 0xffffffffffffffff) {
          return false;
        }
        __p = (pointer)operator_new__(uVar5 + 1,(nothrow_t *)&std::nothrow);
        std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                  ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)this_00,__p);
        if (uVar5 == 0) {
          this->data_size = 0;
        }
        else {
          if ((this_00->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
              super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) {
            this->data_size = 0;
            return false;
          }
          std::istream::seekg(this->pstream,uVar4,0);
          std::istream::read((char *)this->pstream,
                             (long)(this->data)._M_t.
                                   super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
                                   super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
                                   super__Head_base<0UL,_char_*,_false>._M_head_impl);
          if (*(ulong *)(this->pstream + 8) != uVar5) {
            std::__uniq_ptr_impl<char,_std::default_delete<char[]>_>::reset
                      ((__uniq_ptr_impl<char,_std::default_delete<char[]>_> *)this_00,(pointer)0x0);
            this->data_size = 0;
            return false;
          }
          this->data_size = uVar5;
          (this->data)._M_t.super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
          super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl[uVar5] = '\0';
        }
        this->is_loaded = true;
        return true;
      }
      if (((this_00->_M_t).super___uniq_ptr_impl<char,_std::default_delete<char[]>_>._M_t.
           super__Tuple_impl<0UL,_char_*,_std::default_delete<char[]>_>.
           super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) &&
         (iVar3 = (*(this->super_section)._vptr_section[5])(this), iVar3 != 0)) {
        iVar3 = (*(this->super_section)._vptr_section[5])(this);
        bVar6 = iVar3 == 8;
      }
    }
    this->is_loaded = bVar6;
    return bVar6;
  }
  return false;
}

Assistant:

bool load_data() const
    {
        Elf_Xword sh_offset = (*translator)[(*convertor)(header.sh_offset)];
        Elf_Xword size = get_size();
        
        // Check for integer overflow in offset calculation
        if (sh_offset > get_stream_size()) {
            return false;
        }
        
        // Check for integer overflow in size calculation
        if (size > get_stream_size() || 
            size > (get_stream_size() - sh_offset)) {
            return false;
        }

        // Check if we need to load data
        if (nullptr == data && SHT_NULL != get_type() && SHT_NOBITS != get_type()) {
            // Check if size can be safely converted to size_t
            if (size > std::numeric_limits<size_t>::max() - 1) {
                return false;
            }
            
            data.reset(new (std::nothrow) char[size_t(size) + 1]);

            if ((0 != size) && (nullptr != data)) {
                pstream->seekg(sh_offset);
                pstream->read(data.get(), size);
                if (static_cast<Elf_Xword>(pstream->gcount()) != size) {
                    data.reset(nullptr);
                    data_size = 0;
                    return false;
                }

                data_size = size;
                data.get()[size] = 0; // Safe now as we allocated size + 1
            }
            else {
                data_size = 0;
                if (size != 0) {
                    return false; // Failed to allocate required memory
                }
            }
            
            is_loaded = true;
            return true;
        }

        // Data already loaded or doesn't need loading
        is_loaded = (nullptr != data) || (SHT_NULL == get_type()) || (SHT_NOBITS == get_type());
        return is_loaded;
    }